

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O1

QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::FourierMotzkinConf::Lhs> *
__thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::next(QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Inferences::ALASCA::FourierMotzkinConf::Lhs>
       *__return_storage_ptr__,
      Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
      *this)

{
  BacktrackData ***pppBVar1;
  char cVar2;
  bool bVar3;
  void **head;
  SelectedSummand *this_00;
  TypedTermList TVar4;
  Renaming normalizer;
  Renaming local_60;
  ResultSubstitution local_30;
  RefCounter *local_28;
  
  do {
    if ((this->_leafData).
        super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>.
        _isSome == true) {
      cVar2 = (**(code **)(*(long *)(this->_leafData).
                                    super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>
                                    ._elem._elem + 0x10))();
      if (cVar2 != '\0') break;
    }
    bVar3 = findNextLeaf(this);
  } while (bVar3);
  this_00 = (SelectedSummand *)
            (**(code **)(*(long *)(this->_leafData).
                                  super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>
                                  ._elem._elem + 0x18))();
  if (this->_retrieveSubstitution == true) {
    local_60._data._timestamp = 1;
    local_60._data._size = 0;
    local_60._data._deleted = 0;
    local_60._data._capacityIndex = 0;
    local_60._data._capacity = 0;
    local_60._data._20_8_ = 0;
    local_60._data._28_8_ = 0;
    local_60._36_8_ = 0;
    local_60._identity = true;
    TVar4 = Kernel::SelectedSummand::key(this_00);
    Kernel::Renaming::normalizeVariables(&local_60,TVar4.super_TermList._content);
    Kernel::Renaming::normalizeVariables(&local_60,(uint64_t)TVar4._sort._content);
    if ((this->_algo)._subs.super_Backtrackable._bdStack._cursor ==
        (this->_algo)._subs.super_Backtrackable._bdStack._end) {
      ::Lib::Stack<Lib::BacktrackData_*>::expand((Stack<Lib::BacktrackData_*> *)this);
    }
    *(this->_algo)._subs.super_Backtrackable._bdStack._cursor = &this->_normalizationBacktrackData;
    pppBVar1 = &(this->_algo)._subs.super_Backtrackable._bdStack._cursor;
    *pppBVar1 = *pppBVar1 + 1;
    this->_normalizationRecording = true;
    Kernel::RobSubstitution::denormalize((RobSubstitution *)this,&local_60,2,1);
    ::Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
              (&local_60._data);
  }
  ResultSubstitution::fromSubstitution(&local_30,(RobSubstitution *)this,0,1);
  (__return_storage_ptr__->unifier)._obj = (ResultSubstitution *)local_30._vptr_ResultSubstitution;
  (__return_storage_ptr__->unifier)._refCnt = local_28;
  if (local_28 != (RefCounter *)0x0 &&
      (ResultSubstitution *)local_30._vptr_ResultSubstitution != (ResultSubstitution *)0x0) {
    local_28->_val = local_28->_val + 1;
  }
  __return_storage_ptr__->data = (Lhs *)this_00;
  if (((ResultSubstitution *)local_30._vptr_ResultSubstitution != (ResultSubstitution *)0x0 &&
       local_28 != (RefCounter *)0x0) && (local_28->_val = local_28->_val + -1, local_28->_val == 0)
     ) {
    (**(_func_int **)((long)*local_30._vptr_ResultSubstitution + 8))();
    if (local_28 != (RefCounter *)0x0) {
      *(undefined8 *)local_28 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_28;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QueryRes<Unifier, LeafData> next()
      {
        while(!hasLeafData() && findNextLeaf()) {}
        ASS(hasLeafData());

        ASS(!_normalizationRecording);

        auto ld = _leafData->next();
        if (_retrieveSubstitution) {
            Renaming normalizer;
            normalizer.normalizeVariables(ld->key());

            ASS(_normalizationBacktrackData.isEmpty());
            _algo.bdRecord(_normalizationBacktrackData);
            _normalizationRecording=true;

            _algo.denormalize(normalizer);
        }

        DEBUG_QUERY(1, "leaf data: ", *ld)
        return QueryRes(_algo.unifier(), ld);
      }